

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O1

void __thiscall egc::Sequencer::DIM(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short word;
  uint uVar3;
  ostream *poVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DIM",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,instruction & 0x3ff,0);
  if ((word != 0) && (word != 0x7fff)) {
    uVar3 = (uint)word;
    if ((word >> 0xe & 1) == 0) {
      uVar3 = uVar3 + ((uVar3 + 0x7ffe & 0xffff) >> 0xf) + 0x7ffe;
    }
    else {
      uVar3 = uVar3 + ((word + 1 & 0xffff) >> 0xf) + 1;
    }
    word = (unsigned_short)(uVar3 & 0x7fff);
    if ((uVar3 & 0x7fff) == 0) {
      word = 0x7fff;
    }
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                instruction & 0x3ff,word);
  return;
}

Assistant:

void egc::Sequencer::DIM (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "DIM" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);

    if (mk != 000000u && mk != 077777u)
    {
        unsigned short sign = mk & 040000u;

        if (sign == 040000u)
        {
            mk = AddWords(mk, 000001u).first;
        }
        else
        {
            mk = AddWords(mk, 077776u).first;
        }
    }

    m_Memory->Write(k, mk);
}